

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator-(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double *pdVar2;
  Matrix3x3 *A;
  Matrix3x3 *this_local;
  Matrix3x3 *B;
  
  Matrix3x3(__return_storage_ptr__);
  pdVar2 = operator()(this,0,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,0,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,0,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,0,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,1,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,1,2);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,0);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,0);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,1);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,1);
  *pdVar2 = -dVar1;
  pdVar2 = operator()(this,2,2);
  dVar1 = *pdVar2;
  pdVar2 = operator()(__return_storage_ptr__,2,2);
  *pdVar2 = -dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator-( void ) const {

   // returns -A
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2);
    B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2);
    B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2);

    return B;
  }